

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

State __thiscall QAccessibleMenuItem::state(QAccessibleMenuItem *this)

{
  Data *pDVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  QMenu *this_00;
  QAction *pQVar5;
  QMenuBar *this_01;
  QStyle *pQVar6;
  State SVar7;
  QWidget *this_02;
  uint uVar8;
  uint uVar9;
  
  pDVar1 = (this->m_owner).wp.d;
  bVar2 = true;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     (this_02 = (QWidget *)(this->m_owner).wp.value, this_02 == (QWidget *)0x0)) {
    uVar9 = 0;
    this_02 = (QWidget *)0x0;
  }
  else {
    if ((this_02->data->widget_attributes & 0x8000) == 0) {
LAB_00519246:
      uVar9 = 0x20000;
    }
    else {
      cVar3 = QAction::isVisible();
      uVar9 = 0;
      if (cVar3 == '\0') goto LAB_00519246;
    }
    bVar2 = false;
  }
  this_00 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  if (this_00 == (QMenu *)0x0) {
    this_01 = (QMenuBar *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    uVar8 = uVar9;
    if (this_01 == (QMenuBar *)0x0) goto LAB_005192a1;
    pQVar5 = QMenuBar::activeAction(this_01);
  }
  else {
    pQVar5 = QMenu::activeAction(this_00);
  }
  uVar8 = uVar9 | 8;
  if (pQVar5 != this->m_action) {
    uVar8 = uVar9;
  }
LAB_005192a1:
  uVar9 = uVar8;
  if (!bVar2) {
    pQVar6 = QWidget::style(this_02);
    iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x14,0,this_02,0);
    uVar9 = uVar8 | 0x200;
    if (iVar4 == 0) {
      uVar9 = uVar8;
    }
  }
  cVar3 = QAction::isSeparator();
  if ((cVar3 != '\0') || (cVar3 = QAction::isEnabled(), cVar3 == '\0')) {
    uVar9 = uVar9 | 1;
  }
  cVar3 = QAction::isChecked();
  uVar8 = uVar9 | 0x40;
  if (cVar3 == '\0') {
    uVar8 = uVar9;
  }
  cVar3 = QAction::isCheckable();
  uVar9 = uVar8 | 0x20;
  if (cVar3 == '\0') {
    uVar9 = uVar8;
  }
  SVar7._4_4_ = 0;
  SVar7._0_4_ = uVar9;
  return SVar7;
}

Assistant:

QAccessible::State QAccessibleMenuItem::state() const
{
    QAccessible::State s;
    QWidget *own = owner();

    if (own && (own->testAttribute(Qt::WA_WState_Visible) == false || m_action->isVisible() == false)) {
        s.invisible = true;
    }

    if (QMenu *menu = qobject_cast<QMenu*>(own)) {
        if (menu->activeAction() == m_action)
            s.focused = true;
#if QT_CONFIG(menubar)
    } else if (QMenuBar *menuBar = qobject_cast<QMenuBar*>(own)) {
        if (menuBar->activeAction() == m_action)
            s.focused = true;
#endif
    }
    if (own && own->style()->styleHint(QStyle::SH_Menu_MouseTracking, nullptr, own))
        s.hotTracked = true;
    if (m_action->isSeparator() || !m_action->isEnabled())
        s.disabled = true;
    if (m_action->isChecked())
        s.checked = true;
    if (m_action->isCheckable())
        s.checkable = true;

    return s;
}